

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

size_t absl::lts_20250127::str_format_internal::(anonymous_namespace)::
       PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                 (unsigned_long digits,Buffer *out)

{
  undefined1 auVar1 [16];
  size_t local_20;
  size_t printed;
  Buffer *out_local;
  unsigned_long digits_local;
  
  local_20 = 0;
  out_local = (Buffer *)digits;
  if (digits != 0) {
    for (; out_local != (Buffer *)0x0; out_local = (Buffer *)((ulong)out_local / 10)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = out_local;
      str_format_internal::anon_unknown_0::Buffer::push_front
                (out,SUB161(auVar1 % ZEXT816(10),0) + '0');
    }
    local_20 = str_format_internal::anon_unknown_0::Buffer::size(out);
    str_format_internal::anon_unknown_0::Buffer::push_front(out,*out->begin);
    out->begin[1] = '.';
  }
  return local_20;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}